

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O2

char * Io_ReadDsdFindEnd(char *pCur)

{
  int iVar1;
  char cVar2;
  
  if (*pCur != '(') {
    __assert_fail("*pCur == \'(\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                  ,0x31,"char *Io_ReadDsdFindEnd(char *)");
  }
  iVar1 = 0;
  cVar2 = '(';
  while( true ) {
    if (cVar2 == '(') {
      iVar1 = iVar1 + 1;
    }
    else if (cVar2 == ')') {
      iVar1 = iVar1 + -1;
    }
    else if (cVar2 == '\0') {
      return (char *)0x0;
    }
    if (iVar1 == 0) break;
    cVar2 = pCur[1];
    pCur = pCur + 1;
  }
  return pCur;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds the end of the part.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Io_ReadDsdFindEnd( char * pCur )
{
    char * pEnd;
    int nParts = 0;
    assert( *pCur == '(' );
    for ( pEnd = pCur; *pEnd; pEnd++ )
    {
        if ( *pEnd == '(' )
            nParts++;
        else if ( *pEnd == ')' )
            nParts--;
        if ( nParts == 0 )
            return pEnd;
    }
    return NULL;
}